

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O0

HTABLE_NODE *
htable_lookup_internal
          (HTABLE *htable,uint32_t hash,HTABLE_NODE *key,HTABLE_NODE ***p_ref,
          HTABLE_CMP_FUNC cmp_func)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  long *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  long *in_RDI;
  code *in_R8;
  size_t index;
  HTABLE_NODE **plane;
  int i;
  HTABLE_NODE **ref;
  HTABLE_NODE *node;
  int local_44;
  HTABLE_NODE *local_40;
  HTABLE_NODE *local_38;
  
  local_44 = (int)in_RDI[1];
  do {
    local_44 = local_44 + -1;
    if (local_44 < 0) {
      return (HTABLE_NODE *)0x0;
    }
    lVar1 = *(long *)(*in_RDI + (long)local_44 * 8);
    uVar2 = (ulong)in_ESI % (ulong)(uint)(0x3b << ((byte)local_44 & 0x1f));
    local_40 = (HTABLE_NODE *)(lVar1 + uVar2 * 8);
    for (local_38 = *(HTABLE_NODE **)(lVar1 + uVar2 * 8); local_38 != (HTABLE_NODE *)0x0;
        local_38 = local_38->next) {
      iVar3 = (*in_R8)(in_RDX,local_38);
      if (iVar3 == 0) {
        if (in_RCX != (long *)0x0) {
          *in_RCX = (long)local_40;
        }
        return local_38;
      }
      local_40 = local_38;
    }
  } while( true );
}

Assistant:

static HTABLE_NODE*
htable_lookup_internal(HTABLE* htable, uint32_t hash, const HTABLE_NODE* key,
                       HTABLE_NODE*** p_ref, HTABLE_CMP_FUNC cmp_func)
{
    HTABLE_NODE* node;
    HTABLE_NODE** ref;
    int i;

    /* It's better to lookup the biggest planes first, as much more stuff is
     * stored there, and also because it's moire recently inserted stuff which
     * is arguably more likely to accessed soon. */
    for(i = htable->n_planes-1; i >= 0; i--) {
        HTABLE_NODE** plane;
        size_t index;

        plane = (HTABLE_NODE**) htable->planes[i];
        index = hash % HTABLE_PLANE_SIZE(i);

        ref = &plane[index];
        node = plane[index];

        while(node != NULL) {
            if(cmp_func(key, node) == 0) {
                if(p_ref != NULL)
                    *p_ref = ref;
                return node;
            }

            ref = &node->next;
            node = node->next;
        }
    }

    return NULL;
}